

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_while(Parser *psr)

{
  BcIns ins;
  int jmp_idx_00;
  Function *pFVar1;
  Node NVar2;
  int false_case;
  int jmp_idx;
  int true_case;
  Node condition;
  int start;
  Parser *psr_local;
  
  lex_next(&psr->lxr);
  pFVar1 = psr_fn(psr);
  condition.field_1.jmp.false_list = pFVar1->ins_count;
  NVar2 = parse_expr(psr);
  condition._0_8_ = NVar2.field_1;
  jmp_idx = NVar2.type;
  expr_to_jmp(psr,(Node *)&jmp_idx);
  jmp_ensure_true_falls_through(psr,(Node *)&jmp_idx);
  pFVar1 = psr_fn(psr);
  jmp_list_patch(psr,condition.type,pFVar1->ins_count);
  lex_expect(&psr->lxr,0x7b);
  lex_next(&psr->lxr);
  parse_block(psr);
  lex_expect(&psr->lxr,0x7d);
  lex_next(&psr->lxr);
  pFVar1 = psr_fn(psr);
  ins = bc_new1(BC_LOOP,0);
  jmp_idx_00 = fn_emit(pFVar1,ins);
  jmp_set_target(psr,jmp_idx_00,condition.field_1.jmp.false_list);
  pFVar1 = psr_fn(psr);
  jmp_list_patch(psr,condition._4_4_,pFVar1->ins_count);
  return;
}

Assistant:

static void parse_while(Parser *psr) {
	// Skip the `while` token
	lex_next(&psr->lxr);

	// Save the start of the loop
	int start = psr_fn(psr)->ins_count;

	// Parse the condition
	Node condition = parse_expr(psr);
	expr_to_jmp(psr, &condition);
	jmp_ensure_true_falls_through(psr, &condition);

	// Patch the true case here
	int true_case = psr_fn(psr)->ins_count;
	jmp_list_patch(psr, condition.jmp.true_list, true_case);

	// Parse the body of the loop
	lex_expect(&psr->lxr, '{');
	lex_next(&psr->lxr);
	parse_block(psr);
	lex_expect(&psr->lxr, '}');
	lex_next(&psr->lxr);

	// Add a jump back to the start
	int jmp_idx = fn_emit(psr_fn(psr), bc_new1(BC_LOOP, 0));
	jmp_set_target(psr, jmp_idx, start);

	// Patch the false case here
	int false_case = psr_fn(psr)->ins_count;
	jmp_list_patch(psr, condition.jmp.false_list, false_case);
}